

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBufferDescriptor.h
# Opt level: O3

void aeron::concurrent::logbuffer::LogBufferDescriptor::checkPageSize(int32_t pageSize)

{
  char *pcVar1;
  long *plVar2;
  SourcedException *pSVar3;
  char *pcVar4;
  size_type *psVar5;
  char *pcVar6;
  allocator local_109;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (pageSize < 0x1000) {
    pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_e8,0x1000);
    std::operator+(&local_c8,"page size less than min size of ",&local_e8);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_108._M_dataplus._M_p = (pointer)*plVar2;
    psVar5 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_108._M_dataplus._M_p == psVar5) {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108.field_2._8_8_ = plVar2[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar5;
    }
    local_108._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::to_string(&local_68,pageSize);
    std::operator+(&local_a8,&local_108,&local_68);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkPageSize(std::int32_t)"
               ,"");
    pcVar6 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
    ;
    pcVar4 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
    do {
      pcVar4 = pcVar4 + 1;
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
    } while (*pcVar4 == *pcVar1);
    std::__cxx11::string::string((string *)&local_48,pcVar6 + (*pcVar1 == '/'),&local_109);
    util::SourcedException::SourcedException(pSVar3,&local_a8,&local_88,&local_48,0xb3);
    *(undefined ***)pSVar3 = &PTR__SourcedException_00164480;
    __cxa_throw(pSVar3,&util::IllegalStateException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  if ((uint)pageSize < 0x40000001) {
    if ((pageSize + 0x7fffffffU & pageSize) == 0) {
      return;
    }
    pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_108,pageSize);
    std::operator+(&local_a8,"page size not a power of 2, size=",&local_108);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkPageSize(std::int32_t)"
               ,"");
    pcVar6 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
    ;
    pcVar4 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
    do {
      pcVar4 = pcVar4 + 1;
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
    } while (*pcVar4 == *pcVar1);
    std::__cxx11::string::string
              ((string *)&local_e8,pcVar6 + (*pcVar1 == '/'),(allocator *)&local_68);
    util::SourcedException::SourcedException(pSVar3,&local_a8,&local_c8,&local_e8,0xc0);
    *(undefined ***)pSVar3 = &PTR__SourcedException_00164480;
    __cxa_throw(pSVar3,&util::IllegalStateException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_e8,0x40000000);
  std::operator+(&local_c8,"page size greater than max size of ",&local_e8);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_108._M_dataplus._M_p = (pointer)*plVar2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_108._M_dataplus._M_p == psVar5) {
    local_108.field_2._M_allocated_capacity = *psVar5;
    local_108.field_2._8_8_ = plVar2[3];
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar5;
  }
  local_108._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::to_string(&local_68,pageSize);
  std::operator+(&local_a8,&local_108,&local_68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkPageSize(std::int32_t)",
             "");
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
  ;
  pcVar4 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
  do {
    pcVar4 = pcVar4 + 1;
    pcVar1 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
  } while (*pcVar4 == *pcVar1);
  std::__cxx11::string::string((string *)&local_48,pcVar6 + (*pcVar1 == '/'),&local_109);
  util::SourcedException::SourcedException(pSVar3,&local_a8,&local_88,&local_48,0xba);
  *(undefined ***)pSVar3 = &PTR__SourcedException_00164480;
  __cxa_throw(pSVar3,&util::IllegalStateException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

inline void checkPageSize(std::int32_t pageSize)
{
    if (pageSize < AERON_PAGE_MIN_SIZE)
    {
        throw util::IllegalStateException(
            "page size less than min size of " + std::to_string(AERON_PAGE_MIN_SIZE) +
            ", size=" + std::to_string(pageSize), SOURCEINFO);
    }

    if (pageSize > AERON_PAGE_MAX_SIZE)
    {
        throw util::IllegalStateException(
            "page size greater than max size of " + std::to_string(AERON_PAGE_MAX_SIZE) +
            ", size=" + std::to_string(pageSize), SOURCEINFO);
    }

    if (!util::BitUtil::isPowerOfTwo(pageSize))
    {
        throw util::IllegalStateException(
            "page size not a power of 2, size=" + std::to_string(pageSize), SOURCEINFO);
    }
}